

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

MessageHandle<perfetto::protos::pbzero::TracePacket>
perfetto::internal::TrackEventInternal::NewTracePacket
          (TraceWriterBase *trace_writer,TrackEventIncrementalState *incr_state,
          TrackEventTlsState *tls_state,TraceTimestamp timestamp,uint32_t seq_flags)

{
  TrackEventTlsState *pTVar1;
  ulong uVar2;
  ulong uVar3;
  ulong value;
  long lVar4;
  uint value_00;
  undefined4 in_register_0000008c;
  uint in_stack_00000008;
  
  lVar4 = timestamp._0_8_;
  value = CONCAT44(in_register_0000008c,seq_flags);
  value_00 = (uint)timestamp.value;
  if ((uint)timestamp.value == 0x40 && *(uint *)(lVar4 + 0x10) != 0x40) {
    value_00 = *(uint *)(lVar4 + 0x10);
  }
  (**(code **)(*(long *)incr_state + 0x10))(trace_writer);
  uVar2 = *(ulong *)(lVar4 + 8);
  if (value_00 == 0x40) {
    pTVar1 = tls_state + 0x21;
    uVar3._0_1_ = pTVar1->enable_thread_time_sampling;
    uVar3._1_1_ = pTVar1->filter_debug_annotations;
    uVar3._2_1_ = pTVar1->filter_dynamic_event_names;
    uVar3._3_5_ = *(undefined5 *)&pTVar1->field_0x3;
    if (uVar3 <= value) {
      protozero::Message::AppendVarInt<unsigned_long>
                ((Message *)trace_writer->_vptr_TraceWriterBase,8,(value - *(ulong *)pTVar1) / uVar2
                );
      tls_state[0x21].enable_thread_time_sampling = (bool)(char)seq_flags;
      tls_state[0x21].filter_debug_annotations = (bool)(char)(seq_flags >> 8);
      tls_state[0x21].filter_dynamic_event_names = (bool)(char)(seq_flags >> 0x10);
      *(int5 *)&tls_state[0x21].field_0x3 = (int5)(value >> 0x18);
      goto LAB_002aa216;
    }
    protozero::Message::AppendVarInt<unsigned_long>
              ((Message *)trace_writer->_vptr_TraceWriterBase,8,value / uVar2);
    value_00 = 0x41;
    if (uVar2 == 1) {
      value_00 = 6;
    }
  }
  else {
    if (value_00 == *(uint *)(lVar4 + 0x10)) {
      protozero::Message::AppendVarInt<unsigned_long>
                ((Message *)trace_writer->_vptr_TraceWriterBase,8,value / uVar2);
      goto LAB_002aa216;
    }
    protozero::Message::AppendVarInt<unsigned_long>
              ((Message *)trace_writer->_vptr_TraceWriterBase,8,value);
  }
  protozero::Message::AppendVarInt<unsigned_int>
            ((Message *)trace_writer->_vptr_TraceWriterBase,0x3a,value_00);
LAB_002aa216:
  protozero::Message::AppendVarInt<unsigned_int>
            ((Message *)trace_writer->_vptr_TraceWriterBase,0xd,in_stack_00000008);
  return (MessageHandle<perfetto::protos::pbzero::TracePacket>)(MessageHandleBase)trace_writer;
}

Assistant:

protozero::MessageHandle<protos::pbzero::TracePacket>
TrackEventInternal::NewTracePacket(TraceWriterBase* trace_writer,
                                   TrackEventIncrementalState* incr_state,
                                   const TrackEventTlsState& tls_state,
                                   TraceTimestamp timestamp,
                                   uint32_t seq_flags) {
  if (PERFETTO_UNLIKELY(tls_state.default_clock != kClockIdIncremental &&
                        timestamp.clock_id == kClockIdIncremental)) {
    timestamp.clock_id = tls_state.default_clock;
  }
  auto packet = trace_writer->NewTracePacket();
  auto ts_unit_multiplier = tls_state.timestamp_unit_multiplier;
  if (PERFETTO_LIKELY(timestamp.clock_id == kClockIdIncremental)) {
    if (PERFETTO_LIKELY(incr_state->last_timestamp_ns <= timestamp.value)) {
      // No need to set the clock id here, since kClockIdIncremental is the
      // clock id assumed by default.
      auto time_diff_ns = timestamp.value - incr_state->last_timestamp_ns;
      packet->set_timestamp(time_diff_ns / ts_unit_multiplier);
      incr_state->last_timestamp_ns = timestamp.value;
    } else {
      packet->set_timestamp(timestamp.value / ts_unit_multiplier);
      packet->set_timestamp_clock_id(ts_unit_multiplier == 1
                                         ? static_cast<uint32_t>(GetClockId())
                                         : kClockIdAbsolute);
    }
  } else if (PERFETTO_LIKELY(timestamp.clock_id == tls_state.default_clock)) {
    packet->set_timestamp(timestamp.value / ts_unit_multiplier);
  } else {
    packet->set_timestamp(timestamp.value);
    packet->set_timestamp_clock_id(timestamp.clock_id);
  }
  packet->set_sequence_flags(seq_flags);
  return packet;
}